

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O0

int RAWToARGB(uint8_t *src_raw,int src_stride_raw,uint8_t *dst_argb,int dst_stride_argb,int width,
             int height)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_int *RAWToARGBRow;
  int y;
  code *local_38;
  int local_30;
  uint local_28;
  int local_24;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  local_38 = RAWToARGBRow_C;
  if ((((in_RDI == 0) || (in_RDX == 0)) || ((int)in_R8D < 1)) || (in_R9D == 0)) {
    local_4 = -1;
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (in_R9D < 0) {
      in_R9D = -in_R9D;
      local_10 = in_RDI + (in_R9D + -1) * in_ESI;
      local_14 = -in_ESI;
    }
    local_28 = in_R8D;
    local_24 = in_ECX;
    if ((local_14 == in_R8D * 3) && (in_ECX == in_R8D << 2)) {
      local_28 = in_R9D * in_R8D;
      in_R9D = 1;
      local_24 = 0;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(in_R9D);
    if ((iVar1 != 0) && (local_38 = RAWToARGBRow_Any_SSSE3, (local_28 & 0xf) == 0)) {
      local_38 = RAWToARGBRow_SSSE3;
    }
    local_20 = in_RDX;
    for (local_30 = 0; local_30 < in_R9D; local_30 = local_30 + 1) {
      (*local_38)(local_10,local_20,local_28);
      local_10 = local_10 + local_14;
      local_20 = local_20 + local_24;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int RAWToARGB(const uint8_t* src_raw,
              int src_stride_raw,
              uint8_t* dst_argb,
              int dst_stride_argb,
              int width,
              int height) {
  int y;
  void (*RAWToARGBRow)(const uint8_t* src_rgb, uint8_t* dst_argb, int width) =
      RAWToARGBRow_C;
  if (!src_raw || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_raw = src_raw + (height - 1) * src_stride_raw;
    src_stride_raw = -src_stride_raw;
  }
  // Coalesce rows.
  if (src_stride_raw == width * 3 && dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    src_stride_raw = dst_stride_argb = 0;
  }
#if defined(HAS_RAWTOARGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    RAWToARGBRow = RAWToARGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      RAWToARGBRow = RAWToARGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_RAWTOARGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    RAWToARGBRow = RAWToARGBRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      RAWToARGBRow = RAWToARGBRow_NEON;
    }
  }
#endif
#if defined(HAS_RAWTOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    RAWToARGBRow = RAWToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      RAWToARGBRow = RAWToARGBRow_MMI;
    }
  }
#endif
#if defined(HAS_RAWTOARGBROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    RAWToARGBRow = RAWToARGBRow_Any_MSA;
    if (IS_ALIGNED(width, 16)) {
      RAWToARGBRow = RAWToARGBRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    RAWToARGBRow(src_raw, dst_argb, width);
    src_raw += src_stride_raw;
    dst_argb += dst_stride_argb;
  }
  return 0;
}